

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O0

void result_tests::ExpectSuccess<int,int>(Result<int> *result,bilingual_str *str,int *args)

{
  bool bVar1;
  T *pTVar2;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffe08;
  lazy_ostream *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  const_string *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  size_t line_num;
  const_string *in_stack_fffffffffffffe40;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffe48;
  unit_test_log_t *this;
  bilingual_str *in_stack_fffffffffffffe90;
  Result<int> *in_stack_fffffffffffffe98;
  undefined1 local_118 [8];
  const_string *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [32];
  unit_test_log_t local_d8 [2];
  const_string local_c8;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 local_b0 [16];
  undefined1 local_a0 [70];
  lazy_ostream local_5a;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ExpectResult<int>(in_stack_fffffffffffffe98,SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0),
                    in_stack_fffffffffffffe90);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18,
               (pointer)in_stack_fffffffffffffe10,(unsigned_long)in_stack_fffffffffffffe08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe10,(char (*) [1])in_stack_fffffffffffffe08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18,
               (pointer)in_stack_fffffffffffffe10,(unsigned_long)in_stack_fffffffffffffe08);
    local_5a._vptr_lazy_ostream._1_1_ =
         util::Result<int>::has_value((Result<int> *)in_stack_fffffffffffffe08);
    local_5a._vptr_lazy_ostream._0_1_ = 1;
    in_stack_fffffffffffffe18 = "true";
    in_stack_fffffffffffffe10 = &local_5a;
    in_stack_fffffffffffffe08 = "result.has_value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_48,(undefined1 *)((long)&local_5a._vptr_lazy_ostream + 2),0x41,1,2,
               (undefined1 *)((long)&local_5a._vptr_lazy_ostream + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18,
               (pointer)in_stack_fffffffffffffe10,(unsigned_long)in_stack_fffffffffffffe08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe10,(char (*) [1])in_stack_fffffffffffffe08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18,
               (pointer)in_stack_fffffffffffffe10,(unsigned_long)in_stack_fffffffffffffe08);
    pTVar2 = util::Result<int>::value((Result<int> *)in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 = "T{std::forward<Args>(args)...}";
    in_stack_fffffffffffffe10 = (lazy_ostream *)&stack0xffffffffffffff4c;
    in_stack_fffffffffffffe08 = "result.value()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_a0,local_b0,0x42,1,2,pTVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_c8;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18,
               (pointer)in_stack_fffffffffffffe10,(unsigned_long)in_stack_fffffffffffffe08);
    this = local_d8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08);
    boost::unit_test::unit_test_log_t::set_checkpoint(this,file,line_num,in_stack_fffffffffffffe30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe10,(char (*) [1])in_stack_fffffffffffffe08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18,
               (pointer)in_stack_fffffffffffffe10,(unsigned_long)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe30 =
         (const_string *)util::Result<int>::value((Result<int> *)in_stack_fffffffffffffe18);
    local_110 = in_stack_fffffffffffffe30;
    local_118 = (undefined1  [8])
                util::Result<int>::operator*((Result<int> *)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe18 = "&*result";
    in_stack_fffffffffffffe10 = (lazy_ostream *)local_118;
    in_stack_fffffffffffffe08 = "&result.value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int_const*,int_const*>
              (local_f8,local_108,0x43,1,2,&local_110);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ExpectSuccess(const util::Result<T>& result, const bilingual_str& str, Args&&... args)
{
    ExpectResult(result, true, str);
    BOOST_CHECK_EQUAL(result.has_value(), true);
    BOOST_CHECK_EQUAL(result.value(), T{std::forward<Args>(args)...});
    BOOST_CHECK_EQUAL(&result.value(), &*result);
}